

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O2

Error __thiscall asmjit::x86::Compiler::onAttach(Compiler *this,CodeHolder *code)

{
  Error EVar1;
  Error EVar2;
  
  if ((code->_environment)._arch - 1 < 2) {
    EVar1 = BaseCompiler::onAttach(&this->super_BaseCompiler,code);
    if (EVar1 == 0) {
      EVar2 = BaseBuilder::addPassT<asmjit::x86::X86RAPass>((BaseBuilder *)this);
      EVar1 = 0;
      if (EVar2 != 0) {
        (*(this->super_BaseCompiler).super_BaseBuilder.super_BaseEmitter._vptr_BaseEmitter[0x11])
                  (this,code);
        EVar1 = EVar2;
      }
    }
    return EVar1;
  }
  return 4;
}

Assistant:

inline uint32_t arch() const noexcept { return _arch; }